

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O2

void jpc_seglist_remove(jpc_dec_seglist_t *list,jpc_dec_seg_t *seg)

{
  jpc_dec_seg_s *pjVar1;
  jpc_dec_seg_s *pjVar2;
  jpc_dec_seg_s *pjVar3;
  
  pjVar2 = seg->next;
  pjVar1 = seg->prev;
  pjVar3 = pjVar1;
  if (pjVar1 == (jpc_dec_seg_s *)0x0) {
    pjVar3 = (jpc_dec_seg_s *)list;
  }
  pjVar3->next = pjVar2;
  if (pjVar2 == (jpc_dec_seg_s *)0x0) {
    pjVar2 = (jpc_dec_seg_s *)list;
  }
  pjVar2->prev = pjVar1;
  seg->next = (jpc_dec_seg_s *)0x0;
  seg->prev = (jpc_dec_seg_s *)0x0;
  return;
}

Assistant:

void jpc_seglist_remove(jpc_dec_seglist_t *list, jpc_dec_seg_t *seg)
{
	jpc_dec_seg_t *prev;
	jpc_dec_seg_t *next;

	prev = seg->prev;
	next = seg->next;
	if (prev) {
		prev->next = next;
	} else {
		list->head = next;
	}
	if (next) {
		next->prev = prev;
	} else {
		list->tail = prev;
	}
	seg->prev = 0;
	seg->next = 0;
}